

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

RegexPattern *
Js::JavascriptRegExp::CreatePattern(Var aValue,Var options,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t csz;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  charcount_t cszOpts;
  JavascriptString *pJVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RegexPattern *pRVar9;
  char16 *pszOpts;
  
  bVar3 = VarIs<Js::JavascriptString>(aValue);
  if (bVar3) {
    pJVar7 = VarTo<Js::JavascriptString>(aValue);
  }
  else {
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bb04b3;
      *puVar8 = 0;
    }
    bVar3 = TaggedInt::Is(aValue);
    if ((ulong)aValue >> 0x32 == 0 && !bVar3) {
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00bb04b3;
        *puVar8 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) {
          pJVar7 = JavascriptLibrary::GetEmptyString
                             ((scriptContext->super_ScriptContextBase).javascriptLibrary);
          goto LAB_00bb041f;
        }
      }
      else {
        BVar5 = RecyclableObject::IsExternal(this);
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) {
LAB_00bb04b3:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
      }
    }
    pJVar7 = JavascriptConversion::ToString(aValue,scriptContext);
  }
LAB_00bb041f:
  csz = JavascriptString::GetLength(pJVar7);
  iVar4 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(pJVar7);
  if (options != (Var)0x0) {
    BVar5 = JavascriptOperators::IsUndefinedObject(options);
    if (BVar5 == 0) {
      bVar3 = VarIs<Js::JavascriptString>(options);
      if (bVar3) {
        pJVar7 = VarTo<Js::JavascriptString>(options);
      }
      else {
        pJVar7 = JavascriptConversion::ToString(options,scriptContext);
      }
      iVar6 = (*(pJVar7->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar7);
      pszOpts = (char16 *)CONCAT44(extraout_var_00,iVar6);
      cszOpts = JavascriptString::GetLength(pJVar7);
      goto LAB_00bb0491;
    }
  }
  cszOpts = 0;
  pszOpts = (char16 *)0x0;
LAB_00bb0491:
  pRVar9 = RegexHelper::CompileDynamic
                     (scriptContext,(char16 *)CONCAT44(extraout_var,iVar4),csz,pszOpts,cszOpts,false
                     );
  return pRVar9;
}

Assistant:

UnifiedRegex::RegexPattern* JavascriptRegExp::CreatePattern(Var aValue, Var options, ScriptContext *scriptContext)
    {
        JavascriptString * strBody;

        if (VarIs<JavascriptString>(aValue))
        {
            strBody = VarTo<JavascriptString>(aValue);
        }
        else if (JavascriptOperators::GetTypeId(aValue) == TypeIds_Undefined)
        {
            strBody = scriptContext->GetLibrary()->GetEmptyString();
        }
        else
        {
            strBody = JavascriptConversion::ToString(aValue, scriptContext); // must be null terminated!
        }

        int cBody = strBody->GetLength();
        const char16 *szRegex = strBody->GetSz();
        int cOpts = 0;
        const char16 *szOptions = nullptr;

        JavascriptString * strOptions = nullptr;
        if (options != nullptr && !JavascriptOperators::IsUndefinedObject(options))
        {
            if (VarIs<JavascriptString>(options))
            {
                strOptions = VarTo<JavascriptString>(options);
            }
            else
            {
                strOptions = JavascriptConversion::ToString(options, scriptContext);
            }

            szOptions = strOptions->GetSz(); // must be null terminated!
            cOpts = strOptions->GetLength();
        }

        UnifiedRegex::RegexPattern* pattern = RegexHelper::CompileDynamic(scriptContext, szRegex, cBody, szOptions, cOpts, false);

        return pattern;
    }